

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::ResetCache(DFA *this,RWLocker *cache_lock)

{
  DFAStateCacheResetCallback *pDVar1;
  long lVar2;
  DFAStateCacheReset local_18;
  
  RWLocker::LockForWriting(cache_lock);
  pDVar1 = hooks::GetDFAStateCacheResetHook();
  local_18.state_budget = this->state_budget_;
  local_18.state_cache_size = (this->state_cache_)._M_h._M_element_count;
  (*pDVar1)(&local_18);
  lVar2 = 0x1d;
  do {
    (&this->prog_)[lVar2] = (Prog *)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x25);
  ClearCache(this);
  this->mem_budget_ = this->state_budget_;
  return;
}

Assistant:

void DFA::ResetCache(RWLocker* cache_lock) {
  // Re-acquire the cache_mutex_ for writing (exclusive use).
  cache_lock->LockForWriting();

  hooks::GetDFAStateCacheResetHook()({
      state_budget_,
      state_cache_.size(),
  });

  // Clear the cache, reset the memory budget.
  for (int i = 0; i < kMaxStart; i++)
    start_[i].start.store(NULL, std::memory_order_relaxed);
  ClearCache();
  mem_budget_ = state_budget_;
}